

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.h
# Opt level: O0

void __thiscall zsummer::log4z::CStringStream::WriteData<int>(CStringStream *this,char *ft,int t)

{
  int iVar1;
  int local_20;
  int count;
  int len;
  int t_local;
  char *ft_local;
  CStringStream *this_local;
  
  if (this->m_pCur < this->m_pEnd) {
    iVar1 = (int)this->m_pEnd - (int)this->m_pCur;
    local_20 = snprintf(this->m_pCur,(long)iVar1,ft,(ulong)(uint)t);
    if (local_20 < 0) {
      *this->m_pCur = '\0';
      local_20 = 0;
    }
    else if (iVar1 <= local_20) {
      this->m_pEnd[-1] = '\0';
      local_20 = iVar1;
    }
    this->m_pCur = this->m_pCur + local_20;
  }
  return;
}

Assistant:

inline void WriteData(const char * ft, T t)
	{
		if (m_pCur < m_pEnd)
		{
			int len = 0;
			int count = (int)(m_pEnd - m_pCur);
#if defined(WIN32) || defined(WIN64)
			len = _snprintf(m_pCur, count, ft, t);
			if (len == count || (len == -1 && errno == ERANGE))
			{
				len = count;
				*(m_pEnd-1) = '\0';
			}
			else if (len < 0)
			{
				*m_pCur = '\0';
				len = 0;
			}
#else
			len = snprintf(m_pCur, count, ft, t);
			if (len < 0)
			{
				*m_pCur = '\0';
				len = 0;
			}
			else if (len >= count)
			{
				len = count;
				*(m_pEnd-1) = '\0';
			}
#endif
			m_pCur += len;
		}
	}